

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O1

int Abc_ZddBuildSet(Abc_ZddMan *p,int *pSet,int Size)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  if (1 < Size) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      uVar6 = uVar3 & 0xffffffff;
      uVar4 = uVar2;
      do {
        uVar5 = (uint)uVar4;
        if (pSet[(int)(uint)uVar6] <= pSet[uVar4]) {
          uVar5 = (uint)uVar6;
        }
        uVar4 = uVar4 + 1;
        uVar6 = (ulong)uVar5;
      } while ((uint)Size != uVar4);
      iVar1 = pSet[uVar3];
      pSet[uVar3] = pSet[(int)uVar5];
      uVar3 = uVar3 + 1;
      pSet[(int)uVar5] = iVar1;
      uVar2 = uVar2 + 1;
    } while (uVar3 != Size - 1);
  }
  if (Size < 1) {
    iVar1 = 1;
  }
  else {
    lVar7 = (ulong)(uint)Size + 1;
    iVar1 = 1;
    do {
      iVar1 = Abc_ZddUniqueCreate(p,pSet[lVar7 + -2],iVar1,0);
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  return iVar1;
}

Assistant:

int Abc_ZddBuildSet( Abc_ZddMan * p, int * pSet, int Size )
{
    int i, Res = 1;
    Vec_IntSelectSort( pSet, Size );
    for ( i = Size - 1; i >= 0; i-- )
        Res = Abc_ZddUniqueCreate( p, pSet[i], Res, 0 );
    return Res;
}